

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O2

bool tinyjson::atod(char *s,char *s_end,double *result)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  char cVar7;
  ulong uVar8;
  byte *pbVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  
  if (s_end <= s) {
    return false;
  }
  cVar7 = *s;
  if ((cVar7 == '-') || (cVar7 == '+')) {
    pbVar9 = (byte *)(s + 1);
    s = (char *)pbVar9;
    if (pbVar9 == (byte *)s_end) goto LAB_001028b3;
    bVar10 = true;
    dVar12 = 0.0;
    if (*pbVar9 != 0x2e) goto LAB_001028b9;
LAB_00102931:
    iVar4 = -1;
    for (uVar8 = 1; s = (char *)(pbVar9 + uVar8), s != s_end; uVar8 = uVar8 + 1) {
      uVar3 = (uint)*s;
      if (9 < uVar3 - 0x30) goto LAB_001029bc;
      if (uVar8 < 8) {
        dVar11 = atod::pow_lut[uVar8];
      }
      else {
        dVar11 = pow(10.0,(double)iVar4);
      }
      dVar12 = dVar12 + (double)(int)(uVar3 - 0x30) * dVar11;
      iVar4 = iVar4 + -1;
    }
LAB_00102a68:
    if (cVar7 != '+') {
      dVar12 = -dVar12;
    }
    *result = dVar12;
    bVar10 = true;
  }
  else {
    if ((int)cVar7 - 0x30U < 10) {
      cVar7 = '+';
LAB_001028b3:
      bVar10 = s != s_end;
LAB_001028b9:
      dVar12 = 0.0;
      iVar4 = 0;
      while ((bVar10 && ((int)*s - 0x30U < 10))) {
        dVar12 = dVar12 * 10.0 + (double)(int)((int)*s - 0x30U);
        s = (char *)((byte *)s + 1);
        bVar10 = s != s_end;
        iVar4 = iVar4 + -1;
      }
      if (iVar4 != 0) {
        if (bVar10) goto LAB_00102912;
        goto LAB_00102a68;
      }
    }
    else if (cVar7 == '.') {
      cVar7 = '+';
      dVar12 = 0.0;
LAB_00102912:
      bVar1 = *s;
      uVar3 = (uint)bVar1;
      if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
LAB_001029bc:
        if ((uVar3 & 0xff | 0x20) == 0x65) {
          pbVar9 = (byte *)s + 1;
          bVar1 = ((byte *)s)[1];
          if ((pbVar9 == (byte *)s_end) || ((bVar1 != 0x2d && (bVar1 != 0x2b)))) {
            if (9 < (int)(char)bVar1 - 0x30U) goto LAB_00102a7e;
            iVar4 = 1;
          }
          else {
            pbVar9 = (byte *)s + 2;
            iVar4 = (uint)(bVar1 == 0x2b) * 2 + -1;
          }
          iVar2 = (int)s_end - (int)pbVar9;
          iVar6 = 0;
          for (lVar5 = 0; pbVar9 + lVar5 != (byte *)s_end; lVar5 = lVar5 + 1) {
            uVar3 = (int)(char)pbVar9[lVar5] - 0x30;
            if (9 < uVar3) {
              iVar2 = (int)lVar5;
              break;
            }
            iVar6 = uVar3 + iVar6 * 10;
          }
          if (iVar2 == 0) goto LAB_00102a7e;
          if (iVar6 != 0) {
            dVar11 = pow(5.0,(double)(iVar6 * iVar4));
            dVar12 = ldexp(dVar11 * dVar12,iVar6 * iVar4);
          }
        }
      }
      else {
        pbVar9 = (byte *)s;
        if (bVar1 == 0x2e) goto LAB_00102931;
      }
      goto LAB_00102a68;
    }
LAB_00102a7e:
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

static bool atod(const char *s, const char *s_end, double *result) {
    if (s >= s_end) {
      return false;
    }

    double mantissa = 0.0;
    // This exponent is base 2 rather than 10.
    // However the exponent we parse is supposed to be one of ten,
    // thus we must take care to convert the exponent/and or the
    // mantissa to a * 2^E, where a is the mantissa and E is the
    // exponent.
    // To get the final double we will use ldexp, it requires the
    // exponent to be in base 2.
    int exponent = 0;

    // NOTE: THESE MUST BE DECLARED HERE SINCE WE ARE NOT ALLOWED
    // TO JUMP OVER DEFINITIONS.
    char sign = '+';
    char exp_sign = '+';
    char const *curr = s;

    // How many characters were read in a loop.
    int read = 0;
    // Tells whether a loop terminated due to reaching s_end.
    bool end_not_reached = false;
    bool leading_decimal_dots = false;

    /*
            BEGIN PARSING.
    */

    // Find out what sign we've got.
    if (*curr == '+' || *curr == '-') {
      sign = *curr;
      curr++;
      if ((curr != s_end) && (*curr == '.')) {
        // accept. Somethig like `.7e+2`, `-.5234`
        leading_decimal_dots = true;
      }
    } else if (is_digit(*curr)) { /* Pass through. */
    } else if (*curr == '.') {
      // accept. Somethig like `.7e+2`, `-.5234`
      leading_decimal_dots = true;
    } else {
      goto fail;
    }

    // Read the integer part.
    end_not_reached = (curr != s_end);
    if (!leading_decimal_dots) {
      while (end_not_reached && is_digit(*curr)) {
        mantissa *= 10;
        mantissa += static_cast<int>(*curr - 0x30);
        curr++;
        read++;
        end_not_reached = (curr != s_end);
      }

      // We must make sure we actually got something.
      if (read == 0) goto fail;
    }

    // We allow numbers of form "#", "###" etc.
    if (!end_not_reached) goto assemble;

    // Read the decimal part.
    if (*curr == '.') {
      curr++;
      read = 1;
      end_not_reached = (curr != s_end);
      while (end_not_reached && is_digit(*curr)) {
        static const double pow_lut[] = {
                1.0, 0.1, 0.01, 0.001, 0.0001, 0.00001, 0.000001, 0.0000001,
        };
        const int lut_entries = sizeof pow_lut / sizeof pow_lut[0];

        // NOTE: Don't use powf here, it will absolutely murder precision.
        mantissa += static_cast<int>(*curr - 0x30) *
                    (read < lut_entries ? pow_lut[read] : std::pow(10.0, -read));
        read++;
        curr++;
        end_not_reached = (curr != s_end);
      }
    } else if (*curr == 'e' || *curr == 'E') {
    } else {
      goto assemble;
    }

    if (!end_not_reached) goto assemble;

    // Read the exponent part.
    if (*curr == 'e' || *curr == 'E') {
      curr++;
      // Figure out if a sign is present and if it is.
      end_not_reached = (curr != s_end);
      if (end_not_reached && (*curr == '+' || *curr == '-')) {
        exp_sign = *curr;
        curr++;
      } else if (is_digit(*curr)) { /* Pass through. */
      } else {
        // Empty E is not allowed.
        goto fail;
      }

      read = 0;
      end_not_reached = (curr != s_end);
      while (end_not_reached && is_digit(*curr)) {
        exponent *= 10;
        exponent += static_cast<int>(*curr - 0x30);
        curr++;
        read++;
        end_not_reached = (curr != s_end);
      }
      exponent *= (exp_sign == '+' ? 1 : -1);
      if (read == 0) goto fail;
    }

    assemble:
    *result = (sign == '+' ? 1 : -1) *
              (exponent ? std::ldexp(mantissa * std::pow(5.0, exponent), exponent)
                        : mantissa);
    return true;
    fail:
    return false;
  }